

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::CreateSortKeyFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  OrderModifiers modifiers;
  idx_t size;
  bool bVar1;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  reference input;
  reference pvVar4;
  tuple<duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_> this;
  ulong __n;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  sort_key_data;
  __uniq_ptr_impl<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
  local_60;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  local_58;
  vector<duckdb::OrderModifiers,_true> *local_38;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar2->bind_info);
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = (vector<duckdb::OrderModifiers,_true> *)(pFVar3 + 1);
    __n = 0;
    do {
      input = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
      size = args->count;
      pvVar4 = vector<duckdb::OrderModifiers,_true>::operator[](local_38,__n >> 1);
      this.
      super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
      .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
            )operator_new(0x78);
      modifiers.order_type = pvVar4->order_type;
      modifiers.null_type = pvVar4->null_type;
      SortKeyVectorData::SortKeyVectorData
                ((SortKeyVectorData *)
                 this.
                 super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
                 .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl,input,size,
                 modifiers);
      local_60._M_t.
      super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
      .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl =
           (tuple<duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>)
           (tuple<duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>)
           this.
           super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
           .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>
                ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
                  *)&local_58,
                 (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                  *)&local_60);
      ::std::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
      ::~unique_ptr((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
                     *)&local_60);
      __n = __n + 2;
    } while (__n < (ulong)(((long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  CreateSortKeyInternal
            ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
              *)&local_58,(vector<duckdb::OrderModifiers,_true> *)(pFVar3 + 1),result,args->count);
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

static void CreateSortKeyFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &bind_data = state.expr.Cast<BoundFunctionExpression>().bind_info->Cast<CreateSortKeyBindData>();

	// prepare the sort key data
	vector<unique_ptr<SortKeyVectorData>> sort_key_data;
	for (idx_t c = 0; c < args.ColumnCount(); c += 2) {
		sort_key_data.push_back(make_uniq<SortKeyVectorData>(args.data[c], args.size(), bind_data.modifiers[c / 2]));
	}
	CreateSortKeyInternal(sort_key_data, bind_data.modifiers, result, args.size());

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}